

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O2

RK_S32 __thiscall
MppMetaService::get_index_of_key(MppMetaService *this,MppMetaKey key,MppMetaType type)

{
  uint uVar1;
  MppTrieInfo *pMVar2;
  RK_U64 val;
  
  val = CONCAT44(type,key >> 0x18 | (key & 0xff0000) >> 8 | (key & 0xff00) << 8 | key << 0x18);
  pMVar2 = mpp_trie_get_info(this->mTrie,(char *)&val);
  if (pMVar2 == (MppTrieInfo *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = (uint)*pMVar2 & 0xfff;
  }
  return uVar1;
}

Assistant:

RK_S32 MppMetaService::get_index_of_key(MppMetaKey key, MppMetaType type)
{
    RK_U64 val = META_KEY_TO_U64(key, type);
    MppTrieInfo *info = mpp_trie_get_info(mTrie, (const char *)&val);

    return info ? info->index : -1;
}